

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void nullcSetEnableLogFiles
               (int enable,_func_void_ptr_char_ptr *openStream,
               _func_void_void_ptr_char_ptr_uint *writeStream,_func_void_void_ptr *closeStream)

{
  _func_void_void_ptr *closeStream_local;
  _func_void_void_ptr_char_ptr_uint *writeStream_local;
  _func_void_ptr_char_ptr *openStream_local;
  int enable_local;
  
  NULLC::enableLogFiles = enable != 0;
  NULLC::openStream = openStream;
  NULLC::writeStream = writeStream;
  NULLC::closeStream = closeStream;
  if (((openStream == (_func_void_ptr_char_ptr *)0x0) &&
      (writeStream == (_func_void_void_ptr_char_ptr_uint *)0x0)) &&
     (closeStream == (_func_void_void_ptr *)0x0)) {
    NULLC::openStream = OutputContext::FileOpen;
    NULLC::writeStream = OutputContext::FileWrite;
    NULLC::closeStream = OutputContext::FileClose;
  }
  return;
}

Assistant:

void nullcSetEnableLogFiles(int enable, void* (*openStream)(const char* name), void (*writeStream)(void *stream, const char *data, unsigned size), void (*closeStream)(void* stream))
{
	NULLC::enableLogFiles = enable != 0;

	if(openStream || writeStream || closeStream)
	{
		NULLC::openStream = openStream;
		NULLC::writeStream = writeStream;
		NULLC::closeStream = closeStream;
	}
	else
	{
		NULLC::openStream = OutputContext::FileOpen;
		NULLC::writeStream = OutputContext::FileWrite;
		NULLC::closeStream = OutputContext::FileClose;
	}
}